

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O3

bool __thiscall
clask::server_t::match
          (server_t *this,string *method,string *s,
          function<void_(const_clask::_func_t_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
          *fn)

{
  pointer pcVar1;
  size_type sVar2;
  _Alloc_hider _Var3;
  long lVar4;
  _node *p_Var5;
  _Alloc_hider __s2;
  size_type __n;
  size_t sVar6;
  int iVar7;
  long lVar8;
  undefined8 uVar9;
  _node *p_Var10;
  bool bVar11;
  string ss;
  string sub;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  long *local_208;
  long local_200;
  long local_1f8 [2];
  string local_1e8;
  undefined1 local_1c8 [24];
  _Alloc_hider local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  function<void_(clask::response_writer_&,_clask::request_&)> local_190;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&)>
  local_170;
  function<clask::response_(clask::request_&)> local_150;
  bool local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  vector<clask::_node,_std::allocator<clask::_node>_> local_108;
  _Any_data *local_e8;
  long local_e0;
  undefined1 local_d8 [24];
  _Alloc_hider local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Any_data local_a0;
  _Manager_type local_90;
  _Any_data local_80;
  _Manager_type local_70;
  _Any_data local_60;
  _Manager_type local_50;
  bool local_40;
  
  local_e8 = (_Any_data *)fn;
  iVar7 = std::__cxx11::string::compare((char *)method);
  p_Var10 = &this->treeGET;
  if (iVar7 != 0) {
    p_Var10 = &this->treePOST;
  }
  _node::_node((_node *)local_d8,p_Var10);
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208 = local_1f8;
  pcVar1 = (s->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,pcVar1,pcVar1 + s->_M_string_length);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_local_buf[0] = '\0';
  do {
    lVar8 = std::__cxx11::string::find((char)&local_208,0x2f);
    if (lVar8 == -1) {
      std::__cxx11::string::substr((ulong)local_1c8,(ulong)&local_208);
      std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1c8);
      lVar8 = local_200;
      _Var3._M_p = local_1e8._M_dataplus._M_p;
      sVar6 = local_1e8._M_string_length;
      lVar4 = local_e0;
      p_Var10 = (_node *)local_d8._0_8_;
      p_Var5 = (_node *)local_d8._8_8_;
      if ((_node *)local_1c8._0_8_ != (_node *)(local_1c8 + 0x10)) {
        operator_delete((void *)local_1c8._0_8_,
                        (ulong)((long)&(((vector<clask::_node,_std::allocator<clask::_node>_> *)
                                        local_1c8._16_8_)->
                                       super__Vector_base<clask::_node,_std::allocator<clask::_node>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 1));
        lVar8 = local_200;
        _Var3._M_p = local_1e8._M_dataplus._M_p;
        sVar6 = local_1e8._M_string_length;
        lVar4 = local_e0;
        p_Var10 = (_node *)local_d8._0_8_;
        p_Var5 = (_node *)local_d8._8_8_;
      }
    }
    else {
      std::__cxx11::string::substr((ulong)local_1c8,(ulong)&local_208);
      std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1c8);
      _Var3._M_p = local_1e8._M_dataplus._M_p;
      sVar6 = local_1e8._M_string_length;
      lVar4 = local_e0;
      p_Var10 = (_node *)local_d8._0_8_;
      p_Var5 = (_node *)local_d8._8_8_;
      if ((_node *)local_1c8._0_8_ != (_node *)(local_1c8 + 0x10)) {
        operator_delete((void *)local_1c8._0_8_,
                        (ulong)((long)&(((vector<clask::_node,_std::allocator<clask::_node>_> *)
                                        local_1c8._16_8_)->
                                       super__Vector_base<clask::_node,_std::allocator<clask::_node>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 1));
        _Var3._M_p = local_1e8._M_dataplus._M_p;
        sVar6 = local_1e8._M_string_length;
        lVar4 = local_e0;
        p_Var10 = (_node *)local_d8._0_8_;
        p_Var5 = (_node *)local_d8._8_8_;
      }
    }
    while( true ) {
      local_e0 = lVar8;
      uVar9 = local_d8._8_8_;
      __n = local_1e8._M_string_length;
      __s2._M_p = local_1e8._M_dataplus._M_p;
      local_1e8._M_dataplus._M_p = _Var3._M_p;
      if (p_Var10 == (_node *)local_d8._8_8_) {
        bVar11 = false;
        local_1e8._M_string_length = sVar6;
        local_e0 = lVar4;
        local_d8._8_8_ = p_Var5;
        goto LAB_00119fec;
      }
      if (p_Var10->placeholder == true) {
        local_1e8._M_string_length = sVar6;
        local_d8._8_8_ = p_Var5;
        url_decode((string *)local_1c8,&local_1e8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8);
        if ((_node *)local_1c8._0_8_ != (_node *)(local_1c8 + 0x10)) {
          operator_delete((void *)local_1c8._0_8_,
                          (ulong)((long)&(((vector<clask::_node,_std::allocator<clask::_node>_> *)
                                          local_1c8._16_8_)->
                                         super__Vector_base<clask::_node,_std::allocator<clask::_node>_>
                                         )._M_impl.super__Vector_impl_data._M_start + 1));
        }
        _node::_node((_node *)local_1c8,p_Var10);
        local_108.super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_d8._16_8_;
        local_108.super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_d8._8_8_;
        local_108.super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_d8._0_8_;
        local_d8._16_8_ = local_1c8._16_8_;
        local_d8._0_8_ = local_1c8._0_8_;
        local_d8._8_8_ = local_1c8._8_8_;
        local_1c8._0_8_ = (_node *)0x0;
        local_1c8._8_8_ = (_node *)0x0;
        local_1c8._16_8_ = (pointer)0x0;
        std::vector<clask::_node,_std::allocator<clask::_node>_>::~vector(&local_108);
        std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_1b0);
        std::function<void_(clask::response_writer_&,_clask::request_&)>::operator=
                  ((function<void_(clask::response_writer_&,_clask::request_&)> *)&local_a0,
                   &local_190);
        std::
        function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&)>
        ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&)>
                     *)&local_80,&local_170);
        std::function<clask::response_(clask::request_&)>::operator=
                  ((function<clask::response_(clask::request_&)> *)&local_60,&local_150);
        local_40 = local_130;
        if (local_150.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_150.super__Function_base._M_manager)(&local_150,&local_150,3);
        }
        if (local_170.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_170.super__Function_base._M_manager)(&local_170,&local_170,3);
        }
        if (local_190.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_190.super__Function_base._M_manager)(&local_190,&local_190,3);
        }
        goto LAB_00119f3c;
      }
      sVar2 = (p_Var10->name)._M_string_length;
      local_d8._8_8_ = p_Var5;
      if ((sVar2 == 0) ||
         ((bVar11 = sVar2 == local_1e8._M_string_length, local_1e8._M_string_length = sVar6, bVar11
          && (iVar7 = bcmp((p_Var10->name)._M_dataplus._M_p,__s2._M_p,__n),
             sVar6 = local_1e8._M_string_length, iVar7 == 0)))) break;
      lVar8 = local_e0;
      _Var3._M_p = local_1e8._M_dataplus._M_p;
      sVar6 = local_1e8._M_string_length;
      lVar4 = local_e0;
      p_Var10 = p_Var10 + 1;
      p_Var5 = (_node *)local_d8._8_8_;
      local_d8._8_8_ = uVar9;
      local_1e8._M_string_length = __n;
      local_1e8._M_dataplus._M_p = __s2._M_p;
    }
    local_1e8._M_string_length = sVar6;
    _node::_node((_node *)local_1c8,p_Var10);
    local_108.super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_d8._16_8_;
    local_108.super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_d8._8_8_;
    local_108.super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_d8._0_8_;
    local_d8._16_8_ = local_1c8._16_8_;
    local_d8._0_8_ = local_1c8._0_8_;
    local_d8._8_8_ = local_1c8._8_8_;
    local_1c8._0_8_ = (_node *)0x0;
    local_1c8._8_8_ = (_node *)0x0;
    local_1c8._16_8_ = (pointer)0x0;
    std::vector<clask::_node,_std::allocator<clask::_node>_>::~vector(&local_108);
    std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_1b0);
    std::function<void_(clask::response_writer_&,_clask::request_&)>::operator=
              ((function<void_(clask::response_writer_&,_clask::request_&)> *)&local_a0,&local_190);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&)>
    ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&)>
                 *)&local_80,&local_170);
    std::function<clask::response_(clask::request_&)>::operator=
              ((function<clask::response_(clask::request_&)> *)&local_60,&local_150);
    local_40 = local_130;
    if (local_150.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_150.super__Function_base._M_manager)(&local_150,&local_150,3);
    }
    if (local_170.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_170.super__Function_base._M_manager)(&local_170,&local_170,3);
    }
    if (local_190.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_190.super__Function_base._M_manager)(&local_190,&local_190,3);
    }
LAB_00119f3c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_p != &local_1a0) {
      operator_delete(local_1b0._M_p,local_1a0._M_allocated_capacity + 1);
    }
    std::vector<clask::_node,_std::allocator<clask::_node>_>::~vector
              ((vector<clask::_node,_std::allocator<clask::_node>_> *)local_1c8);
    std::__cxx11::string::substr((ulong)local_1c8,(ulong)&local_208);
    std::__cxx11::string::operator=((string *)&local_208,(string *)local_1c8);
    if ((_node *)local_1c8._0_8_ != (_node *)(local_1c8 + 0x10)) {
      operator_delete((void *)local_1c8._0_8_,
                      (ulong)((long)&(((vector<clask::_node,_std::allocator<clask::_node>_> *)
                                      local_1c8._16_8_)->
                                     super__Vector_base<clask::_node,_std::allocator<clask::_node>_>
                                     )._M_impl.super__Vector_impl_data._M_start + 1));
    }
    if ((local_200 == 0) || (local_d8._0_8_ == local_d8._8_8_)) {
      if (*(long *)(local_e8 + 1) == 0) {
        uVar9 = std::__throw_bad_function_call();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,
                          CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                                   local_1e8.field_2._M_local_buf[0]) + 1);
        }
        if (local_208 != local_1f8) {
          operator_delete(local_208,local_1f8[0] + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_128);
        _node::~_node((_node *)local_d8);
        _Unwind_Resume(uVar9);
      }
      bVar11 = true;
      (**(code **)((long)local_e8 + 0x18))(local_e8,(_func_t *)&local_a0,&local_128);
LAB_00119fec:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,
                        CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                                 local_1e8.field_2._M_local_buf[0]) + 1);
      }
      if (local_208 != local_1f8) {
        operator_delete(local_208,local_1f8[0] + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_128);
      if (local_50 != (_Manager_type)0x0) {
        (*local_50)(&local_60,&local_60,__destroy_functor);
      }
      if (local_70 != (_Manager_type)0x0) {
        (*local_70)(&local_80,&local_80,__destroy_functor);
      }
      if (local_90 != (_Manager_type)0x0) {
        (*local_90)(&local_a0,&local_a0,__destroy_functor);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_p != &local_b0) {
        operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
      }
      std::vector<clask::_node,_std::allocator<clask::_node>_>::~vector
                ((vector<clask::_node,_std::allocator<clask::_node>_> *)local_d8);
      return bVar11;
    }
  } while( true );
}

Assistant:

inline bool server_t::match(const std::string& method, const std::string& s, const std::function<void(const func_t& fn, const std::vector<std::string>&)>& fn) const {
  node n = method == "GET" ? treeGET : treePOST;
  std::vector<std::string> args;
  auto ss = s;
  std::string sub;
  while (true) {
    auto pos = ss.find('/', 1);

    if (pos == std::string::npos) {
      sub = ss.substr(1);
      pos = ss.size();
    } else {
      sub = ss.substr(1, pos - 1);
    }
    bool found = false;
    for (const auto& vv : n.children) {
      if (vv.placeholder) {
        args.emplace_back(url_decode(sub));
        n = node(vv);
        found = true;
        break;
      } else if (vv.name.empty() || vv.name == sub) {
        n = node(vv);
        found = true;
        break;
      }
    }
    if (!found)
      break;
    ss = ss.substr(pos);
    if (ss.empty() || n.children.empty()) {
      fn(n.fn, args);
      return true;
    }
  }
  return false;
}